

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_x86_fma.cpp
# Opt level: O2

int __thiscall
ncnn::Cast_x86_fma::forward(Cast_x86_fma *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  uint _c;
  int _elempack;
  int *piVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  undefined1 auVar6 [32];
  unsigned_short uVar7;
  int iVar8;
  _func_int **pp_Var9;
  void *pvVar10;
  _func_int *p_Var11;
  ulong uVar12;
  undefined1 (*pauVar13) [32];
  void *pvVar14;
  undefined1 (*pauVar15) [16];
  int i;
  int iVar16;
  ulong uVar17;
  size_t sVar18;
  ulong uVar19;
  ulong uVar20;
  uint uVar21;
  int iVar22;
  long lVar23;
  undefined1 (*pauVar24) [16];
  int iVar25;
  float fVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  
  p_Var11 = this->_vptr_Cast_x86_fma[-3];
  if (*(int *)(&this->field_0xd0 + (long)p_Var11) == *(int *)(&this->field_0xd4 + (long)p_Var11)) {
    if (top_blob == bottom_blob) {
      return 0;
    }
    piVar2 = bottom_blob->refcount;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    piVar2 = top_blob->refcount;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (top_blob->allocator == (Allocator *)0x0) {
          free(top_blob->data);
        }
        else {
          (*top_blob->allocator->_vptr_Allocator[3])();
        }
      }
    }
    top_blob->cstep = 0;
    top_blob->data = (void *)0x0;
    top_blob->refcount = (int *)0x0;
    *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
    *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
    top_blob->c = 0;
    top_blob->dims = 0;
    top_blob->w = 0;
    top_blob->h = 0;
    top_blob->d = 0;
    piVar2 = bottom_blob->refcount;
    top_blob->data = bottom_blob->data;
    top_blob->refcount = piVar2;
    top_blob->elemsize = bottom_blob->elemsize;
    top_blob->elempack = bottom_blob->elempack;
    top_blob->allocator = bottom_blob->allocator;
    iVar8 = bottom_blob->w;
    iVar22 = bottom_blob->h;
    iVar1 = bottom_blob->d;
    top_blob->dims = bottom_blob->dims;
    top_blob->w = iVar8;
    top_blob->h = iVar22;
    top_blob->d = iVar1;
    top_blob->c = bottom_blob->c;
    top_blob->cstep = bottom_blob->cstep;
    return 0;
  }
  iVar8 = bottom_blob->w;
  iVar22 = bottom_blob->h;
  iVar1 = bottom_blob->d;
  _c = bottom_blob->c;
  iVar25 = bottom_blob->dims;
  _elempack = bottom_blob->elempack;
  sVar18 = (size_t)_elempack;
  switch(*(int *)(&this->field_0xd4 + (long)p_Var11)) {
  case 1:
    if (*(int *)(&this->field_0xd0 + (long)p_Var11) == 3) {
      Cast::forward((Cast *)((long)&this->_vptr_Cast_x86_fma + (long)p_Var11),bottom_blob,top_blob,
                    opt);
    }
    sVar18 = sVar18 * 4;
    break;
  case 2:
  case 4:
    sVar18 = (size_t)(_elempack * 2);
    break;
  case 3:
    break;
  default:
    sVar18 = bottom_blob->elemsize;
  }
  switch(iVar25) {
  case 1:
    Mat::create(top_blob,iVar8,sVar18,_elempack,opt->blob_allocator);
    break;
  case 2:
    Mat::create(top_blob,iVar8,iVar22,sVar18,_elempack,opt->blob_allocator);
    break;
  case 3:
    Mat::create(top_blob,iVar8,iVar22,_c,sVar18,_elempack,opt->blob_allocator);
    break;
  case 4:
    Mat::create(top_blob,iVar8,iVar22,iVar1,_c,sVar18,_elempack,opt->blob_allocator);
  }
  if (top_blob->data == (void *)0x0) {
    return -100;
  }
  if ((long)top_blob->c * top_blob->cstep == 0) {
    return -100;
  }
  pp_Var9 = this->_vptr_Cast_x86_fma;
  p_Var11 = pp_Var9[-3];
  iVar25 = *(int *)(&this->field_0xd0 + (long)p_Var11);
  if (iVar25 == 1) {
    if (*(int *)(&this->field_0xd4 + (long)p_Var11) == 2) {
      iVar25 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
      uVar20 = 0;
      uVar12 = (ulong)(uint)bottom_blob->c;
      if (bottom_blob->c < 1) {
        uVar12 = uVar20;
      }
      for (; uVar20 != uVar12; uVar20 = uVar20 + 1) {
        pvVar10 = bottom_blob->data;
        sVar18 = bottom_blob->elemsize;
        sVar3 = bottom_blob->cstep;
        pauVar13 = (undefined1 (*) [32])(sVar3 * uVar20 * sVar18 + (long)pvVar10);
        pvVar14 = top_blob->data;
        sVar4 = top_blob->elemsize;
        sVar5 = top_blob->cstep;
        pauVar15 = (undefined1 (*) [16])(sVar5 * uVar20 * sVar4 + (long)pvVar14);
        lVar23 = 0;
        for (iVar16 = 0; iVar16 + 7 < iVar25; iVar16 = iVar16 + 8) {
          auVar27 = vcvtps2ph_f16c(*pauVar13,8);
          *pauVar15 = auVar27;
          pauVar13 = pauVar13 + 1;
          pauVar15 = pauVar15 + 1;
          lVar23 = lVar23 + 8;
        }
        for (; iVar16 + 3 < iVar25; iVar16 = iVar16 + 4) {
          vcvtps2ph_f16c(*(undefined1 (*) [16])*pauVar13,8);
          pauVar13 = (undefined1 (*) [32])(*pauVar13 + 0x10);
          lVar23 = lVar23 + 4;
        }
        for (; (int)lVar23 < iVar25; lVar23 = lVar23 + 1) {
          uVar7 = float32_to_float16(*(float *)((long)pvVar10 + lVar23 * 4 + sVar3 * sVar18 * uVar20
                                               ));
          *(unsigned_short *)((long)pvVar14 + lVar23 * 2 + sVar5 * sVar4 * uVar20) = uVar7;
        }
      }
      pp_Var9 = this->_vptr_Cast_x86_fma;
      p_Var11 = pp_Var9[-3];
      iVar25 = *(int *)(&this->field_0xd0 + (long)p_Var11);
      goto LAB_00449183;
    }
  }
  else {
LAB_00449183:
    if (iVar25 == 2) {
      if (*(int *)(&this->field_0xd4 + (long)p_Var11) != 1) goto LAB_004493f9;
      iVar25 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
      uVar20 = 0;
      uVar12 = (ulong)(uint)bottom_blob->c;
      if (bottom_blob->c < 1) {
        uVar12 = uVar20;
      }
      for (; uVar20 != uVar12; uVar20 = uVar20 + 1) {
        pvVar10 = bottom_blob->data;
        sVar18 = bottom_blob->elemsize;
        sVar3 = bottom_blob->cstep;
        pauVar15 = (undefined1 (*) [16])(sVar3 * uVar20 * sVar18 + (long)pvVar10);
        pvVar14 = top_blob->data;
        sVar4 = top_blob->elemsize;
        sVar5 = top_blob->cstep;
        pauVar13 = (undefined1 (*) [32])(sVar5 * uVar20 * sVar4 + (long)pvVar14);
        lVar23 = 0;
        for (iVar16 = 0; iVar16 + 7 < iVar25; iVar16 = iVar16 + 8) {
          auVar6 = vcvtph2ps_f16c(*pauVar15);
          *pauVar13 = auVar6;
          pauVar15 = pauVar15 + 1;
          pauVar13 = pauVar13 + 1;
          lVar23 = lVar23 + 8;
        }
        for (; iVar16 + 3 < iVar25; iVar16 = iVar16 + 4) {
          auVar27._8_8_ = 0;
          auVar27._0_8_ = *(ulong *)*pauVar15;
          auVar27 = vcvtph2ps_f16c(auVar27);
          *(undefined1 (*) [16])*pauVar13 = auVar27;
          pauVar15 = (undefined1 (*) [16])(*pauVar15 + 8);
          pauVar13 = (undefined1 (*) [32])(*pauVar13 + 0x10);
          lVar23 = lVar23 + 4;
        }
        for (; (int)lVar23 < iVar25; lVar23 = lVar23 + 1) {
          fVar26 = float16_to_float32(*(unsigned_short *)
                                       ((long)pvVar10 + lVar23 * 2 + sVar3 * sVar18 * uVar20));
          *(float *)((long)pvVar14 + lVar23 * 4 + sVar5 * sVar4 * uVar20) = fVar26;
        }
      }
      pp_Var9 = this->_vptr_Cast_x86_fma;
      p_Var11 = pp_Var9[-3];
      iVar25 = *(int *)(&this->field_0xd0 + (long)p_Var11);
    }
    if (iVar25 == 3) {
      if (*(int *)(&this->field_0xd4 + (long)p_Var11) != 1) goto LAB_004493f9;
      uVar21 = iVar1 * _elempack * iVar22 * iVar8;
      pvVar10 = bottom_blob->data;
      sVar18 = bottom_blob->cstep;
      pvVar14 = top_blob->data;
      sVar3 = top_blob->cstep;
      sVar4 = top_blob->elemsize;
      uVar20 = 0;
      uVar12 = (ulong)uVar21;
      if ((int)uVar21 < 1) {
        uVar12 = uVar20;
      }
      uVar19 = (ulong)_c;
      if ((int)_c < 1) {
        uVar19 = uVar20;
      }
      sVar5 = bottom_blob->elemsize;
      for (; uVar20 != uVar19; uVar20 = uVar20 + 1) {
        for (uVar17 = 0; uVar12 != uVar17; uVar17 = uVar17 + 1) {
          *(float *)((long)pvVar14 + uVar17 * 4) = (float)(int)*(char *)((long)pvVar10 + uVar17);
        }
        pvVar14 = (void *)((long)pvVar14 + sVar3 * sVar4);
        pvVar10 = (void *)((long)pvVar10 + sVar18 * sVar5);
      }
      p_Var11 = pp_Var9[-3];
      iVar25 = *(int *)(&this->field_0xd0 + (long)p_Var11);
    }
    if (iVar25 != 1) goto LAB_004493f9;
  }
  if (*(int *)(&this->field_0xd4 + (long)p_Var11) == 4) {
    iVar8 = cpu_support_x86_avx2();
    if (iVar8 == 0) {
      iVar8 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
      uVar20 = 0;
      uVar12 = (ulong)(uint)bottom_blob->c;
      if (bottom_blob->c < 1) {
        uVar12 = uVar20;
      }
      for (; uVar20 != uVar12; uVar20 = uVar20 + 1) {
        pvVar10 = bottom_blob->data;
        sVar18 = bottom_blob->elemsize;
        sVar3 = bottom_blob->cstep;
        pauVar15 = (undefined1 (*) [16])(sVar3 * uVar20 * sVar18 + (long)pvVar10);
        pvVar14 = top_blob->data;
        sVar4 = top_blob->elemsize;
        sVar5 = top_blob->cstep;
        pauVar24 = (undefined1 (*) [16])(sVar5 * uVar20 * sVar4 + (long)pvVar14);
        lVar23 = 0;
        for (iVar22 = 0; iVar22 + 0xf < iVar8; iVar22 = iVar22 + 0x10) {
          auVar27 = vpsrld_avx(*pauVar15,0x10);
          auVar28 = vpsrld_avx(pauVar15[1],0x10);
          auVar27 = vpackusdw_avx(auVar27,auVar28);
          auVar28 = vpsrld_avx(pauVar15[2],0x10);
          auVar29 = vpsrld_avx(pauVar15[3],0x10);
          auVar28 = vpackusdw_avx(auVar28,auVar29);
          pauVar24[1] = auVar28;
          *pauVar24 = auVar27;
          pauVar15 = pauVar15 + 4;
          pauVar24 = pauVar24 + 2;
          lVar23 = lVar23 + 0x10;
        }
        for (; iVar22 + 7 < iVar8; iVar22 = iVar22 + 8) {
          auVar27 = vpsrld_avx(*pauVar15,0x10);
          auVar28 = vpsrld_avx(pauVar15[1],0x10);
          auVar27 = vpackusdw_avx(auVar27,auVar28);
          *pauVar24 = auVar27;
          pauVar15 = pauVar15 + 2;
          pauVar24 = pauVar24 + 1;
          lVar23 = lVar23 + 8;
        }
        for (; (int)lVar23 < iVar8; lVar23 = lVar23 + 1) {
          *(undefined2 *)((long)pvVar14 + lVar23 * 2 + sVar5 * sVar4 * uVar20) =
               *(undefined2 *)((long)pvVar10 + lVar23 * 4 + sVar3 * sVar18 * uVar20 + 2);
        }
      }
    }
    else {
      cast_fp32_to_bf16_sse_avx2(bottom_blob,top_blob,opt);
    }
  }
LAB_004493f9:
  if ((*(int *)(&this->field_0xd0 + (long)this->_vptr_Cast_x86_fma[-3]) == 4) &&
     (*(int *)(&this->field_0xd4 + (long)this->_vptr_Cast_x86_fma[-3]) == 1)) {
    iVar8 = cpu_support_x86_avx2();
    if (iVar8 == 0) {
      iVar8 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
      uVar12 = (ulong)(uint)bottom_blob->c;
      if (bottom_blob->c < 1) {
        uVar12 = 0;
      }
      for (uVar20 = 0; uVar20 != uVar12; uVar20 = uVar20 + 1) {
        pvVar10 = bottom_blob->data;
        sVar18 = bottom_blob->elemsize;
        sVar3 = bottom_blob->cstep;
        pauVar24 = (undefined1 (*) [16])(sVar3 * uVar20 * sVar18 + (long)pvVar10);
        pvVar14 = top_blob->data;
        sVar4 = top_blob->elemsize;
        sVar5 = top_blob->cstep;
        pauVar15 = (undefined1 (*) [16])(sVar5 * uVar20 * sVar4 + (long)pvVar14);
        lVar23 = 0;
        for (iVar22 = 0; iVar22 + 7 < iVar8; iVar22 = iVar22 + 8) {
          auVar28 = vpunpcklwd_avx((undefined1  [16])0x0,*pauVar24);
          auVar27 = vpunpckhwd_avx((undefined1  [16])0x0,*pauVar24);
          pauVar15[1] = auVar27;
          *pauVar15 = auVar28;
          pauVar24 = pauVar24 + 1;
          pauVar15 = pauVar15 + 2;
          lVar23 = lVar23 + 8;
        }
        for (; iVar22 + 3 < iVar8; iVar22 = iVar22 + 4) {
          auVar28._8_8_ = 0;
          auVar28._0_8_ = *(ulong *)*pauVar24;
          auVar27 = vpunpcklwd_avx((undefined1  [16])0x0,auVar28);
          *pauVar15 = auVar27;
          pauVar24 = (undefined1 (*) [16])(*pauVar24 + 8);
          pauVar15 = pauVar15 + 1;
          lVar23 = lVar23 + 4;
        }
        for (; (int)lVar23 < iVar8; lVar23 = lVar23 + 1) {
          *(uint *)((long)pvVar14 + lVar23 * 4 + sVar5 * sVar4 * uVar20) =
               (uint)*(ushort *)((long)pvVar10 + lVar23 * 2 + sVar3 * sVar18 * uVar20) << 0x10;
        }
      }
    }
    else {
      cast_bf16_to_fp32_sse_avx2(bottom_blob,top_blob,opt);
    }
  }
  return 0;
}

Assistant:

int Cast_x86_fma::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (type_from == type_to)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    size_t out_elemsize = elemsize;
    if (type_to == 1)
    {
        if (type_from == 3)
        {
            Cast::forward(bottom_blob, top_blob, opt);
        }

        // float32
        out_elemsize = 4 * elempack;
    }
    else if (type_to == 2)
    {
        // float16
        out_elemsize = 2 * elempack;
    }
    else if (type_to == 3)
    {
        // int8
        out_elemsize = elempack;
    }
    else if (type_to == 4)
    {
        // bfloat16
        out_elemsize = 2 * elempack;
    }

    if (dims == 1)
    {
        top_blob.create(w, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 2)
    {
        top_blob.create(w, h, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 3)
    {
        top_blob.create(w, h, channels, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 4)
    {
        top_blob.create(w, h, d, channels, out_elemsize, elempack, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    int size = w * h * d * elempack;

    if (type_from == 1 && type_to == 2)
    {
        cast_fp32_to_fp16_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 2 && type_to == 1)
    {
        cast_fp16_to_fp32_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 3 && type_to == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const signed char* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                outptr[i] = (float)ptr[i];
            }
        }
    }

    if (type_from == 1 && type_to == 4)
    {
        cast_fp32_to_bf16_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 4 && type_to == 1)
    {
        cast_bf16_to_fp32_sse(bottom_blob, top_blob, opt);
    }

    return 0;
}